

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_12::NameApplier::OnTableInitExpr(NameApplier *this,TableInitExpr *expr)

{
  bool bVar1;
  Result RVar2;
  TableInitExpr *expr_local;
  NameApplier *this_local;
  
  RVar2 = UseNameForElemSegmentVar(this,&expr->segment_index);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    RVar2 = UseNameForTableVar(this,&expr->table_index);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result NameApplier::OnTableInitExpr(TableInitExpr* expr)  {
  CHECK_RESULT(UseNameForElemSegmentVar(&expr->segment_index));
  CHECK_RESULT(UseNameForTableVar(&expr->table_index));
  return Result::Ok;
}